

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<16>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  TriangleRasterizer *pTVar6;
  int i_12;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long *plVar16;
  ulong uVar17;
  long lVar18;
  long *plVar19;
  ulong uVar20;
  long lVar21;
  int i;
  long lVar22;
  ulong uVar23;
  long *plVar24;
  long lVar25;
  long lVar26;
  int fragNdx;
  long lVar27;
  long lVar28;
  Vec4 z0;
  Vector<float,_4> res_10;
  Vec4 z1;
  Vec4 edgeSum;
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 bSum;
  Vector<float,_4> res_14;
  deInt64 sy [4];
  deInt64 sx [4];
  Vector<long,_4> e20 [16];
  Vector<long,_4> e12 [16];
  Vector<long,_4> e01 [16];
  float local_7b8 [4];
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  int local_798;
  int local_794;
  ulong local_790;
  long *local_788;
  long *local_780;
  float local_778 [10];
  float local_750;
  float local_74c;
  float local_748;
  int local_744;
  int local_740;
  int local_73c;
  float local_738 [14];
  TriangleRasterizer *local_700;
  ulong local_6f8;
  ulong local_6f0;
  float local_6e8 [4];
  int *local_6d8;
  FragmentPacket *local_6d0;
  float *local_6c8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  float local_688 [4];
  long local_678 [4];
  long local_658 [65];
  long alStack_450 [64];
  long alStack_250 [68];
  
  uVar2 = (this->m_curPos).m_data[1];
  local_6f0 = 0;
  local_6d8 = numPacketsRasterized;
  if (0 < maxFragmentPackets && (int)uVar2 <= (this->m_bboxMax).m_data[1]) {
    local_748 = (this->m_v2).m_data[2];
    local_74c = (this->m_v0).m_data[2] - local_748;
    local_750 = (this->m_v1).m_data[2] - local_748;
    local_6f0 = 0;
    local_744 = maxFragmentPackets;
    local_700 = this;
    local_6d0 = fragmentPackets;
    local_6c8 = depthValues;
    do {
      pTVar6 = local_700;
      local_790 = (ulong)uVar2;
      uVar3 = (local_700->m_curPos).m_data[0];
      local_6f8 = (ulong)uVar3;
      local_658[0] = (long)(int)(uVar3 << 8);
      local_73c = uVar3 + 1;
      local_658[1] = (long)(local_73c * 0x100);
      local_678[0] = (long)(int)(uVar2 << 8);
      local_740 = uVar2 + 1;
      local_678[2] = (long)(local_740 * 0x100);
      local_798 = (local_700->m_viewport).m_data[3] + (local_700->m_viewport).m_data[1];
      local_794 = (local_700->m_viewport).m_data[2] + (local_700->m_viewport).m_data[0];
      local_678[1] = local_678[0];
      local_678[3] = local_678[2];
      local_658[2] = local_658[0];
      local_658[3] = local_658[1];
      memset(alStack_250 + 3,0,0x200);
      memset(alStack_450 + 3,0,0x200);
      plVar16 = local_658 + 4;
      memset(plVar16,0,0x200);
      lVar15 = (pTVar6->m_edge01).a;
      lVar18 = (pTVar6->m_edge01).b;
      local_6a8 = (pTVar6->m_edge01).c;
      local_6b0 = (pTVar6->m_edge12).a;
      local_6b8 = (pTVar6->m_edge12).b;
      lVar21 = (pTVar6->m_edge12).c;
      lVar22 = (pTVar6->m_edge20).a;
      local_6c0 = (pTVar6->m_edge20).b;
      lVar4 = (pTVar6->m_edge20).c;
      plVar19 = alStack_450 + 3;
      plVar24 = alStack_250 + 3;
      lVar27 = 0;
      do {
        local_6a0 = lVar27;
        local_780 = plVar24;
        local_788 = plVar19;
        local_690 = (&s_samplePos16)[local_6a0 * 2];
        local_698 = (&DAT_01d11698)[local_6a0 * 2];
        lVar27 = 0;
        do {
          lVar7 = local_658[lVar27] + local_690;
          lVar13 = local_678[lVar27] + local_698;
          local_780[lVar27] = lVar18 * lVar13 + lVar15 * lVar7 + local_6a8;
          local_788[lVar27] = local_6b8 * lVar13 + local_6b0 * lVar7 + lVar21;
          plVar16[lVar27] = lVar13 * local_6c0 + lVar7 * lVar22 + lVar4;
          lVar27 = lVar27 + 1;
        } while (lVar27 != 4);
        plVar16 = plVar16 + 4;
        plVar19 = local_788 + 4;
        plVar24 = local_780 + 4;
        lVar27 = local_6a0 + 1;
      } while (local_6a0 + 1 != 0x10);
      uVar14 = (ulong)(local_700->m_edge01).inclusive;
      lVar15 = -uVar14;
      uVar17 = (ulong)(local_700->m_edge12).inclusive;
      lVar18 = -uVar17;
      uVar20 = (ulong)(local_700->m_edge20).inclusive;
      lVar21 = -uVar20;
      lVar22 = 0x18;
      uVar12 = 0;
      uVar8 = 0;
      do {
        lVar4 = *(long *)((long)alStack_250 + lVar22);
        if ((lVar4 == lVar15 || SBORROW8(lVar4,lVar15) != (long)(lVar4 + uVar14) < 0) ||
           (lVar4 = *(long *)((long)alStack_450 + lVar22),
           lVar4 == lVar18 || SBORROW8(lVar4,lVar18) != (long)(lVar4 + uVar17) < 0)) {
          bVar5 = false;
        }
        else {
          lVar4 = *(long *)((long)local_658 + lVar22 + 8);
          bVar5 = lVar4 != lVar21 && SBORROW8(lVar4,lVar21) == (long)(lVar4 + uVar20) < 0;
        }
        uVar9 = uVar8 & ~(1L << (uVar12 & 0x3f));
        if (bVar5) {
          uVar9 = uVar8 | 1L << (uVar12 & 0x3f);
        }
        if (((local_73c == local_794) ||
            (lVar4 = *(long *)((long)alStack_250 + lVar22 + 8),
            lVar4 == lVar15 || SBORROW8(lVar4,lVar15) != (long)(lVar4 + uVar14) < 0)) ||
           (lVar4 = *(long *)((long)alStack_450 + lVar22 + 8),
           lVar4 == lVar18 || SBORROW8(lVar4,lVar18) != (long)(lVar4 + uVar17) < 0)) {
          bVar5 = false;
        }
        else {
          lVar4 = *(long *)((long)local_658 + lVar22 + 0x10);
          bVar5 = lVar4 != lVar21 && SBORROW8(lVar4,lVar21) == (long)(lVar4 + uVar20) < 0;
        }
        bVar10 = (byte)uVar12;
        uVar23 = 0x100000000 << (bVar10 & 0x3f);
        uVar8 = ~uVar23 & uVar9;
        if (bVar5) {
          uVar8 = uVar9 | uVar23;
        }
        if (((local_740 == local_798) ||
            (lVar4 = *(long *)((long)alStack_250 + lVar22 + 0x10),
            lVar4 == lVar15 || SBORROW8(lVar4,lVar15) != (long)(lVar4 + uVar14) < 0)) ||
           (lVar4 = *(long *)((long)alStack_450 + lVar22 + 0x10),
           lVar4 == lVar18 || SBORROW8(lVar4,lVar18) != (long)(lVar4 + uVar17) < 0)) {
          bVar5 = false;
        }
        else {
          lVar4 = *(long *)((long)local_658 + lVar22 + 0x18);
          bVar5 = lVar4 != lVar21 && SBORROW8(lVar4,lVar21) == (long)(lVar4 + uVar20) < 0;
        }
        uVar23 = 0x10000L << (bVar10 & 0x3f);
        uVar9 = ~uVar23 & uVar8;
        if (bVar5) {
          uVar9 = uVar8 | uVar23;
        }
        if (((local_740 == local_798 || local_73c == local_794) ||
            (lVar4 = *(long *)((long)alStack_250 + lVar22 + 0x18),
            lVar4 == lVar15 || SBORROW8(lVar4,lVar15) != (long)(lVar4 + uVar14) < 0)) ||
           (lVar4 = *(long *)((long)alStack_450 + lVar22 + 0x18),
           lVar4 == lVar18 || SBORROW8(lVar4,lVar18) != (long)(lVar4 + uVar17) < 0)) {
          bVar5 = false;
        }
        else {
          lVar4 = *(long *)((long)local_658 + lVar22 + 0x20);
          bVar5 = lVar4 != lVar21 && SBORROW8(lVar4,lVar21) == (long)(lVar4 + uVar20) < 0;
        }
        uVar23 = 0x1000000000000 << (bVar10 & 0x3f);
        uVar8 = ~uVar23 & uVar9;
        if (bVar5) {
          uVar8 = uVar9 | uVar23;
        }
        uVar12 = uVar12 + 1;
        lVar22 = lVar22 + 0x20;
      } while (uVar12 != 0x10);
      iVar11 = (int)local_6f8 + 2;
      (local_700->m_curPos).m_data[0] = iVar11;
      if ((local_700->m_bboxMax).m_data[0] < iVar11) {
        (local_700->m_curPos).m_data[1] = (int)local_790 + 2;
        (local_700->m_curPos).m_data[0] = (local_700->m_bboxMin).m_data[0];
      }
      if (uVar8 != 0) {
        iVar11 = (int)local_6f0;
        if (local_6c8 != (float *)0x0) {
          plVar24 = local_658;
          plVar16 = alStack_450 + 3;
          plVar19 = alStack_250 + 3;
          lVar15 = 0;
          do {
            plVar24 = plVar24 + 4;
            local_738[8] = 0.0;
            local_738[9] = 0.0;
            local_738[10] = 0.0;
            local_738[0xb] = 0.0;
            lVar18 = 0;
            do {
              local_738[lVar18 + 8] = (float)plVar19[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            local_738[4] = 0.0;
            local_738[5] = 0.0;
            local_738[6] = 0.0;
            local_738[7] = 0.0;
            lVar18 = 0;
            do {
              local_738[lVar18 + 4] = (float)plVar16[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            local_738[0] = 0.0;
            local_738[1] = 0.0;
            local_738[2] = 0.0;
            local_738[3] = 0.0;
            lVar18 = 0;
            do {
              local_738[lVar18] = (float)plVar24[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            local_7b8[0] = 0.0;
            local_7b8[1] = 0.0;
            local_7b8[2] = 0.0;
            local_7b8[3] = 0.0;
            lVar18 = 0;
            do {
              local_7b8[lVar18] = local_738[lVar18 + 8] + local_738[lVar18 + 4];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            local_778[4] = 0.0;
            local_778[5] = 0.0;
            local_778[6] = 0.0;
            local_778[7] = 0.0;
            lVar18 = 0;
            do {
              local_778[lVar18 + 4] = local_7b8[lVar18] + local_738[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            local_7b8[0] = 0.0;
            local_7b8[1] = 0.0;
            local_7b8[2] = 0.0;
            local_7b8[3] = 0.0;
            lVar18 = 0;
            do {
              local_7b8[lVar18] = local_738[lVar18 + 4] / local_778[lVar18 + 4];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            local_778[0] = 0.0;
            local_778[1] = 0.0;
            local_778[2] = 0.0;
            local_778[3] = 0.0;
            lVar18 = 0;
            do {
              local_778[lVar18] = local_738[lVar18] / local_778[lVar18 + 4];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            lVar18 = lVar15 + (iVar11 << 6);
            local_6c8[lVar18] = local_7b8[0] * local_74c + local_778[0] * local_750 + local_748;
            local_6c8[lVar18 + 0x10] =
                 local_7b8[1] * local_74c + local_778[1] * local_750 + local_748;
            local_6c8[lVar18 + 0x20] =
                 local_7b8[2] * local_74c + local_778[2] * local_750 + local_748;
            local_6c8[lVar18 + 0x30] =
                 local_7b8[3] * local_74c + local_778[3] * local_750 + local_748;
            lVar15 = lVar15 + 1;
            plVar19 = plVar19 + 4;
            plVar16 = plVar16 + 4;
          } while (lVar15 != 0x10);
        }
        local_788 = (long *)(long)iVar11;
        local_738[8] = 0.0;
        local_738[9] = 0.0;
        local_738[10] = 0.0;
        local_738[0xb] = 0.0;
        local_738[4] = 0.0;
        local_738[5] = 0.0;
        local_738[6] = 0.0;
        local_738[7] = 0.0;
        local_738[0] = 0.0;
        local_738[1] = 0.0;
        local_738[2] = 0.0;
        local_738[3] = 0.0;
        local_780 = (long *)(local_700->m_edge01).a;
        lVar15 = (local_700->m_edge01).b;
        lVar18 = (local_700->m_edge01).c;
        lVar21 = (local_700->m_edge12).a;
        lVar22 = (local_700->m_edge12).b;
        lVar4 = (local_700->m_edge12).c;
        lVar27 = (local_700->m_edge20).a;
        lVar7 = (local_700->m_edge20).b;
        lVar13 = (local_700->m_edge20).c;
        lVar28 = 0;
        do {
          lVar25 = *(long *)((long)local_658 + lVar28 * 2) + 0x80;
          lVar26 = *(long *)((long)local_678 + lVar28 * 2) + 0x80;
          *(float *)((long)local_738 + lVar28 + 0x20) =
               (float)(lVar15 * lVar26 + (long)local_780 * lVar25 + lVar18);
          *(float *)((long)local_738 + lVar28 + 0x10) =
               (float)(lVar22 * lVar26 + lVar21 * lVar25 + lVar4);
          *(float *)((long)local_738 + lVar28) = (float)(lVar26 * lVar7 + lVar25 * lVar27 + lVar13);
          lVar28 = lVar28 + 4;
        } while (lVar28 != 0x10);
        fVar1 = (local_700->m_v0).m_data[3];
        local_778[4] = 0.0;
        local_778[5] = 0.0;
        local_778[6] = 0.0;
        local_778[7] = 0.0;
        lVar15 = 0;
        do {
          local_778[lVar15 + 4] = local_738[lVar15 + 4] * fVar1;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        fVar1 = (local_700->m_v1).m_data[3];
        local_7b8[0] = 0.0;
        local_7b8[1] = 0.0;
        local_7b8[2] = 0.0;
        local_7b8[3] = 0.0;
        lVar15 = 0;
        do {
          local_7b8[lVar15] = local_738[lVar15] * fVar1;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        fVar1 = (local_700->m_v2).m_data[3];
        local_778[0] = 0.0;
        local_778[1] = 0.0;
        local_778[2] = 0.0;
        local_778[3] = 0.0;
        lVar15 = 0;
        do {
          local_778[lVar15] = local_738[lVar15 + 8] * fVar1;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        local_7a8 = 0;
        uStack_7a0 = 0;
        lVar15 = 0;
        do {
          *(float *)((long)&local_7a8 + lVar15 * 4) = local_778[lVar15 + 4] + local_7b8[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        local_6e8[0] = 0.0;
        local_6e8[1] = 0.0;
        local_6e8[2] = 0.0;
        local_6e8[3] = 0.0;
        lVar15 = 0;
        do {
          local_6e8[lVar15] = *(float *)((long)&local_7a8 + lVar15 * 4) + local_778[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        *(ulong *)local_6d0[(long)local_788].position.m_data = (local_790 << 0x20) + local_6f8;
        local_6d0[(long)local_788].coverage = uVar8;
        local_7a8 = 0;
        uStack_7a0 = 0;
        lVar15 = 0;
        do {
          *(float *)((long)&local_7a8 + lVar15 * 4) = local_778[lVar15 + 4] / local_6e8[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        *(undefined8 *)local_6d0[(long)local_788].barycentric[0].m_data = local_7a8;
        *(undefined8 *)(local_6d0[(long)local_788].barycentric[0].m_data + 2) = uStack_7a0;
        local_7a8 = 0;
        uStack_7a0 = 0;
        lVar15 = 0;
        do {
          *(float *)((long)&local_7a8 + lVar15 * 4) = local_7b8[lVar15] / local_6e8[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        *(undefined8 *)local_6d0[(long)local_788].barycentric[1].m_data = local_7a8;
        *(undefined8 *)(local_6d0[(long)local_788].barycentric[1].m_data + 2) = uStack_7a0;
        local_688[0] = 0.0;
        local_688[1] = 0.0;
        local_688[2] = 0.0;
        local_688[3] = 0.0;
        lVar15 = 0;
        do {
          local_688[lVar15] = 1.0 - local_6d0[(long)local_788].barycentric[0].m_data[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        local_7a8 = 0;
        uStack_7a0 = 0;
        lVar15 = 0;
        do {
          *(float *)((long)&local_7a8 + lVar15 * 4) =
               local_688[lVar15] - local_6d0[(long)local_788].barycentric[1].m_data[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        *(undefined8 *)local_6d0[(long)local_788].barycentric[2].m_data = local_7a8;
        *(undefined8 *)(local_6d0[(long)local_788].barycentric[2].m_data + 2) = uStack_7a0;
        local_6f0 = (ulong)(iVar11 + 1);
      }
      uVar2 = (local_700->m_curPos).m_data[1];
    } while (((int)uVar2 <= (local_700->m_bboxMax).m_data[1]) && ((int)local_6f0 < local_744));
  }
  *local_6d8 = (int)local_6f0;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}